

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::anon_unknown_3::CreateContextExtGroup::init
          (CreateContextExtGroup *this,EVP_PKEY_CTX *ctx)

{
  EGLenum EVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar5;
  FilterList *pFVar6;
  TestCase *this_00;
  InternalError *this_01;
  uint uVar7;
  uint uVar8;
  int *__last;
  code *filter_00;
  int *__first;
  long lVar9;
  FilterList filter;
  FilterList local_78;
  CreateContextExtGroup *local_58;
  string local_50;
  
  lVar9 = 0;
  local_58 = this;
LAB_00e2ef3a:
  local_78.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar6 = eglu::FilterList::operator<<
                     (&local_78,(ConfigFilter)(&PTR_colorBits<5,6,5,0>_0211acd0)[lVar9 * 5]);
  pFVar6 = eglu::FilterList::operator<<(pFVar6,(ConfigFilter)(&PTR_noDepth_0211acd8)[lVar9 * 5]);
  pFVar6 = eglu::FilterList::operator<<(pFVar6,(ConfigFilter)(&PTR_noStencil_0211ace0)[lVar9 * 5]);
  iVar5 = this->m_apiBit;
  filter_00 = egl::(anonymous_namespace)::renderable<4u>;
  if (iVar5 != 4) {
    if (iVar5 == 8) {
      filter_00 = egl::(anonymous_namespace)::renderable<8u>;
    }
    else if (iVar5 == 0x40) {
      filter_00 = egl::(anonymous_namespace)::renderable<64u>;
    }
    else {
      filter_00 = egl::(anonymous_namespace)::renderable<0u>;
    }
  }
  eglu::FilterList::operator<<(pFVar6,filter_00);
  this_00 = (TestCase *)operator_new(0xe0);
  EVar1 = this->m_api;
  __first = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  TestCase::TestCase(this_00,(this->super_TestCaseGroup).m_eglTestCtx,
                     (&PTR_anon_var_dwarf_171f469_0211acc0)[lVar9 * 5],
                     (&PTR_anon_var_dwarf_171f480_0211acc8)[lVar9 * 5]);
  (this_00->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CreateContextExtCase_0211aff0;
  *(undefined1 *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined4 *)((long)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  std::
  vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::vector((vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
            *)&this_00[1].super_TestCase.super_TestNode.m_testCtx,&local_78.m_rules);
  __last = __first;
  do {
    iVar5 = *__last;
    __last = __last + 1;
  } while (iVar5 != 0x3038);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)
             this_00[1].super_TestCase.super_TestNode.m_name.field_2._M_local_buf,__first,__last,
             (allocator_type *)&local_50);
  this = local_58;
  *(EGLenum *)&this_00[1].super_TestCase.super_TestNode.m_description._M_string_length = EVar1;
  uVar8 = (uint)(EVar1 != 0x30a0);
  this_00[1].super_TestCase.super_TestNode.m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_00[1].super_TestCase.super_TestNode.m_description.field_2 + 8) = 0;
  *(undefined8 *)&this_00[1].super_TestCase.super_TestNode.m_nodeType = 0;
  this_00[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iVar5 = 0;
  uVar7 = 1;
  uVar4 = 0;
LAB_00e2f05a:
  iVar2 = *__first;
  if (iVar2 < 0x30fc) {
    if (iVar2 < 0x30bf) {
      if (iVar2 == 0x3098) {
        uVar7 = __first[1];
        goto LAB_00e2f0eb;
      }
      if (iVar2 == 0x3038) goto code_r0x00e2f10d;
      goto LAB_00e2f05a;
    }
    if (iVar2 == 0x30bf) goto LAB_00e2f0eb;
    if (iVar2 != 0x30fb) goto LAB_00e2f05a;
    iVar5 = __first[1];
  }
  else if (iVar2 < 0x3138) {
    if (iVar2 != 0x30fc) {
      if (iVar2 == 0x30fd) {
        uVar3 = __first[1];
        if ((uVar3 != 1) && (uVar8 = uVar3, uVar3 != 2)) {
          this_01 = (InternalError *)__cxa_allocate_exception(0x38);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Indeterminate OpenGL profile","");
          tcu::InternalError::InternalError(this_01,&local_50);
          __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        __first = __first + 2;
      }
      goto LAB_00e2f05a;
    }
    uVar4 = uVar4 | ((uint)__first[1] >> 2 & 1) + (__first[1] & 3U) * 2;
  }
  else if ((iVar2 != 0x3138) && (iVar2 != 0x31bd)) goto LAB_00e2f05a;
LAB_00e2f0eb:
  __first = __first + 2;
  goto LAB_00e2f05a;
code_r0x00e2f10d:
  *(uint *)&this_00[1].super_TestCase.super_TestNode.m_children.
            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = uVar8 << 8 | uVar7 | uVar4 << 10 | iVar5 << 4;
  tcu::TestNode::addChild((TestNode *)local_58,(TestNode *)this_00);
  iVar5 = extraout_EAX;
  if (local_78.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar5 = extraout_EAX_00;
  }
  lVar9 = lVar9 + 1;
  if (lVar9 == 0x14) {
    return iVar5;
  }
  goto LAB_00e2ef3a;
}

Assistant:

void CreateContextExtGroup::init (void)
{
	const struct
	{
		const char*				name;
		const char*				description;

		eglu::ConfigFilter		colorFilter;
		eglu::ConfigFilter		depthFilter;
		eglu::ConfigFilter		stencilFilter;
	} groups[] =
	{
		{ "rgb565_no_depth_no_stencil",		"RGB565 configs without depth or stencil",		colorBits<5, 6, 5, 0>, noDepth,		noStencil	},
		{ "rgb565_no_depth_stencil",		"RGB565 configs with stencil and no depth",		colorBits<5, 6, 5, 0>, noDepth,		hasStencil	},
		{ "rgb565_depth_no_stencil",		"RGB565 configs with depth and no stencil",		colorBits<5, 6, 5, 0>, hasDepth,	noStencil	},
		{ "rgb565_depth_stencil",			"RGB565 configs with depth and stencil",		colorBits<5, 6, 5, 0>, hasDepth,	hasStencil	},

		{ "rgb888_no_depth_no_stencil",		"RGB888 configs without depth or stencil",		colorBits<8, 8, 8, 0>, noDepth,		noStencil	},
		{ "rgb888_no_depth_stencil",		"RGB888 configs with stencil and no depth",		colorBits<8, 8, 8, 0>, noDepth,		hasStencil	},
		{ "rgb888_depth_no_stencil",		"RGB888 configs with depth and no stencil",		colorBits<8, 8, 8, 0>, hasDepth,	noStencil	},
		{ "rgb888_depth_stencil",			"RGB888 configs with depth and stencil",		colorBits<8, 8, 8, 0>, hasDepth,	hasStencil	},

		{ "rgba4444_no_depth_no_stencil",	"RGBA4444 configs without depth or stencil",	colorBits<4, 4, 4, 4>, noDepth,		noStencil	},
		{ "rgba4444_no_depth_stencil",		"RGBA4444 configs with stencil and no depth",	colorBits<4, 4, 4, 4>, noDepth,		hasStencil	},
		{ "rgba4444_depth_no_stencil",		"RGBA4444 configs with depth and no stencil",	colorBits<4, 4, 4, 4>, hasDepth,	noStencil	},
		{ "rgba4444_depth_stencil",			"RGBA4444 configs with depth and stencil",		colorBits<4, 4, 4, 4>, hasDepth,	hasStencil	},

		{ "rgba5551_no_depth_no_stencil",	"RGBA5551 configs without depth or stencil",	colorBits<5, 5, 5, 1>, noDepth,		noStencil	},
		{ "rgba5551_no_depth_stencil",		"RGBA5551 configs with stencil and no depth",	colorBits<5, 5, 5, 1>, noDepth,		hasStencil	},
		{ "rgba5551_depth_no_stencil",		"RGBA5551 configs with depth and no stencil",	colorBits<5, 5, 5, 1>, hasDepth,	noStencil	},
		{ "rgba5551_depth_stencil",			"RGBA5551 configs with depth and stencil",		colorBits<5, 5, 5, 1>, hasDepth,	hasStencil	},

		{ "rgba8888_no_depth_no_stencil",	"RGBA8888 configs without depth or stencil",	colorBits<8, 8, 8, 8>, noDepth,		noStencil	},
		{ "rgba8888_no_depth_stencil",		"RGBA8888 configs with stencil and no depth",	colorBits<8, 8, 8, 8>, noDepth,		hasStencil	},
		{ "rgba8888_depth_no_stencil",		"RGBA8888 configs with depth and no stencil",	colorBits<8, 8, 8, 8>, hasDepth,	noStencil	},
		{ "rgba8888_depth_stencil",			"RGBA8888 configs with depth and stencil",		colorBits<8, 8, 8, 8>, hasDepth,	hasStencil	}
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(groups); groupNdx++)
	{
		eglu::FilterList filter;

		filter << groups[groupNdx].colorFilter
			   << groups[groupNdx].depthFilter
			   << groups[groupNdx].stencilFilter
			   << getRenderableFilter(m_apiBit);

		addChild(new CreateContextExtCase(m_eglTestCtx, m_api, &(m_attribList[0]), filter, groups[groupNdx].name, groups[groupNdx].description));
	}
	// \todo [mika] Add other group
}